

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O0

void __thiscall
xLearn::DMATRIX_TEST_Find_Max_Feat_and_Field_Test::TestBody
          (DMATRIX_TEST_Find_Max_Feat_and_Field_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  index_t iVar3;
  index_t iVar4;
  reference pvVar5;
  char *message;
  undefined8 in_RDI;
  undefined1 auVar6 [16];
  DMatrix *unaff_retaddr;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t i;
  DMatrix matrix;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff04;
  uint *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  value_type in_stack_ffffffffffffff1c;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c8;
  index_t local_c4;
  DMatrix *in_stack_ffffffffffffff40;
  AssertHelper in_stack_ffffffffffffff50;
  Message local_a8;
  undefined4 local_a0;
  index_t local_9c;
  AssertionResult local_98;
  ulong local_88;
  vector<float,_std::allocator<float>_> vStack_40;
  vector<float,_std::allocator<float>_> vStack_28;
  index_t in_stack_fffffffffffffff0;
  real_t in_stack_fffffffffffffff4;
  
  DMatrix::DMatrix(in_stack_ffffffffffffff40);
  DMatrix::Reset((DMatrix *)in_stack_ffffffffffffff50.data_);
  for (local_88 = 0; local_88 < 10; local_88 = local_88 + 1) {
    DMatrix::AddRow((DMatrix *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    auVar6 = SUB6416(ZEXT464(0x40200000),0);
    DMatrix::AddNode(unaff_retaddr,(index_t)((ulong)in_RDI >> 0x20),(index_t)in_RDI,
                     in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
    auVar6 = vcvtusi2ss_avx512f(auVar6,local_88);
    in_stack_ffffffffffffff1c = auVar6._0_4_;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&vStack_40,local_88);
    *pvVar5 = in_stack_ffffffffffffff1c;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&vStack_28,local_88);
    *pvVar5 = 0.25;
  }
  DMatrix::SetHash((DMatrix *)&stack0xffffffffffffff90,0x4d2,0x162e);
  iVar3 = DMatrix::MaxFeat((DMatrix *)0x1538c7);
  local_a0 = 9;
  local_9c = iVar3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff1c,iVar3),
             (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,
             (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!(bool)uVar1) {
    testing::Message::Message(&local_a8);
    in_stack_ffffffffffffff08 =
         (uint *)testing::AssertionResult::failure_message((AssertionResult *)0x15394f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x90,(char *)in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff50,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
    testing::Message::~Message((Message *)0x15399d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1539e9);
  iVar4 = DMatrix::MaxField((DMatrix *)0x1539f6);
  local_c8 = 9;
  local_c4 = iVar4;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff1c,iVar3),
             (char *)CONCAT17(uVar1,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08,
             (int *)CONCAT44(iVar4,in_stack_ffffffffffffff00));
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff40);
  uVar7 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff00);
  if (!bVar2) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x153a8d);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x91,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x153ad9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x153b25);
  DMatrix::~DMatrix((DMatrix *)CONCAT44(iVar4,uVar7));
  return;
}

Assistant:

TEST(DMATRIX_TEST, Find_Max_Feat_and_Field) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  EXPECT_EQ(matrix.MaxFeat(), 9);
  EXPECT_EQ(matrix.MaxField(), 9);
}